

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::Combine<duckdb::MinMaxState<int>,duckdb::MinOperation>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  MinMaxState<int> *source_00;
  MinMaxState<int> *in_RCX;
  idx_t i;
  MinMaxState<int> **tdata;
  MinMaxState<int> **sdata;
  MinMaxState<int> *target_00;
  
  FlatVector::GetData<duckdb::MinMaxState<int>const*>((Vector *)0xf9bed2);
  source_00 = (MinMaxState<int> *)FlatVector::GetData<duckdb::MinMaxState<int>*>((Vector *)0xf9bee1)
  ;
  for (target_00 = (MinMaxState<int> *)0x0; target_00 < in_RCX;
      target_00 = (MinMaxState<int> *)((long)&target_00->value + 1)) {
    MinOperation::Combine<duckdb::MinMaxState<int>,duckdb::MinOperation>
              (source_00,target_00,(AggregateInputData *)0xf9bf1d);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}